

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::ReadDebugSectionsFromSegment<segment_command,section>
               (LoadCommand cmd,File *dwarf,RangeSink *sink)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view contents_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view data;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  string_view *psVar4;
  string_view sVar5;
  unsigned_long uncompressed_size;
  string_view *member;
  File *in_stack_00000078;
  string_view in_stack_00000080;
  string_view contents;
  uint64_t filesize;
  string_view sectname;
  section *section;
  uint32_t j;
  uint32_t nsects;
  string_view segname;
  segment_command *segment;
  string_view *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  char *__str;
  File *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  string_view *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  File *local_c0;
  char *in_stack_ffffffffffffff48;
  RangeSink *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  File *local_80;
  char *local_78;
  string_view local_68;
  section *local_58;
  uint local_50;
  uint local_4c;
  size_t local_38;
  char *local_30;
  string_view local_28;
  segment_command *local_18;
  
  __str = &stack0x00000008;
  local_18 = GetStructPointerAndAdvance<segment_command>(in_stack_fffffffffffffee0);
  local_28 = ArrayToStr((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                        (size_t)in_stack_fffffffffffffeb8);
  local_38 = local_28._M_len;
  local_30 = local_28._M_str;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&in_stack_fffffffffffffed0->debug_abbrev,__str);
  __x._M_str = in_stack_fffffffffffffef0;
  __x._M_len = (size_t)in_stack_fffffffffffffee8;
  __y._M_str = (char *)in_stack_fffffffffffffee0;
  __y._M_len = (size_t)in_stack_fffffffffffffed8;
  bVar1 = std::operator!=(__x,__y);
  if (!bVar1) {
    local_4c = local_18->nsects;
    for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
      local_58 = GetStructPointerAndAdvance<section>(in_stack_fffffffffffffee0);
      local_68 = ArrayToStr((char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            (size_t)in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffec4 = (uint)(byte)local_58->flags;
      sVar5._M_str = (char *)in_stack_fffffffffffffee0;
      sVar5._M_len = (size_t)in_stack_fffffffffffffed8;
      sVar5 = StrictSubstr(sVar5,(size_t)in_stack_fffffffffffffed0,(size_t)__str);
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                         (size_type)in_stack_fffffffffffffed0);
      local_80 = (File *)sVar5._M_len;
      local_78 = sVar5._M_str;
      if (sVar2 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&in_stack_fffffffffffffed0->debug_abbrev,__str);
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &stack0xffffffffffffff60);
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_68,sVar3);
        local_c0 = local_80;
        name._M_str = in_stack_fffffffffffffef0;
        name._M_len = (size_t)in_stack_fffffffffffffee8;
        contents_00._M_str = (char *)in_stack_fffffffffffffee0;
        contents_00._M_len = (size_t)in_stack_fffffffffffffed8;
        in_stack_ffffffffffffff50 = (RangeSink *)local_68._M_len;
        in_stack_ffffffffffffff58 = local_68._M_str;
        bloaty::dwarf::File::SetFieldByName(in_stack_fffffffffffffed0,name,contents_00);
        in_stack_ffffffffffffff48 = local_78;
      }
      else {
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                           (size_type)in_stack_fffffffffffffed0);
        if (sVar2 == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&in_stack_fffffffffffffed0->debug_abbrev,__str);
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_d0);
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(&local_68,sVar3);
          psVar4 = bloaty::dwarf::File::GetFieldByName(in_stack_00000078,in_stack_00000080);
          if (psVar4 != (string_view *)0x0) {
            ReadBytes(CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffeb8);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&in_stack_fffffffffffffed0->debug_abbrev,__str);
            __x_00._M_str = in_stack_fffffffffffffef0;
            __x_00._M_len = (size_t)in_stack_fffffffffffffee8;
            __y_00._M_str = (char *)in_stack_fffffffffffffee0;
            __y_00._M_len = (size_t)in_stack_fffffffffffffed8;
            bVar1 = std::operator!=(__x_00,__y_00);
            if (!bVar1) {
              in_stack_fffffffffffffef0 =
                   (char *)ReadBigEndian<unsigned_long>((string_view *)0x1e126d);
              data._M_str = in_stack_ffffffffffffff60;
              data._M_len = (size_t)in_stack_ffffffffffffff58;
              sVar5 = RangeSink::ZlibDecompress
                                (in_stack_ffffffffffffff50,data,(uint64_t)in_stack_ffffffffffffff48)
              ;
              in_stack_fffffffffffffee0 = (string_view *)sVar5._M_len;
              in_stack_fffffffffffffee8 = sVar5._M_str;
              psVar4->_M_len = (size_t)in_stack_fffffffffffffee0;
              psVar4->_M_str = in_stack_fffffffffffffee8;
              in_stack_fffffffffffffed0 = local_80;
              in_stack_fffffffffffffed8 = local_78;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ReadDebugSectionsFromSegment(LoadCommand cmd, dwarf::File *dwarf,
                                  RangeSink *sink) {
  auto segment = GetStructPointerAndAdvance<Segment>(&cmd.command_data);
  string_view segname = ArrayToStr(segment->segname, 16);

  if (segname != "__DWARF") {
    return;
  }

  uint32_t nsects = segment->nsects;
  for (uint32_t j = 0; j < nsects; j++) {
    auto section = GetStructPointerAndAdvance<Section>(&cmd.command_data);
    string_view sectname = ArrayToStr(section->sectname, 16);

    // filesize equals vmsize unless the section is zerofill
    uint64_t filesize = section->size;
    switch (section->flags & SECTION_TYPE) {
      case S_ZEROFILL:
      case S_GB_ZEROFILL:
      case S_THREAD_LOCAL_ZEROFILL:
        filesize = 0;
        break;
      default:
        break;
    }

    string_view contents =
        StrictSubstr(cmd.file_data, section->offset, filesize);

    if (sectname.find("__debug_") == 0) {
      sectname.remove_prefix(string_view("__debug_").size());
      dwarf->SetFieldByName(sectname, contents);
    } else if (sectname.find("__zdebug_") == 0) {
      sectname.remove_prefix(string_view("__zdebug_").size());
      string_view *member = dwarf->GetFieldByName(sectname);
      if (!member || ReadBytes(4, &contents) != "ZLIB") {
        continue;
      }
      auto uncompressed_size = ReadBigEndian<uint64_t>(&contents);
      *member = sink->ZlibDecompress(contents, uncompressed_size);
    }
  }
}